

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O2

unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
* mocker::buildBlockPredecessors
            (unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
             *__return_storage_ptr__,FunctionModule *func)

{
  pointer puVar1;
  vector<unsigned_long,std::allocator<unsigned_long>> *pvVar2;
  mapped_type *this;
  unsigned_long *s;
  pointer __k;
  BasicBlockList *pBVar3;
  _List_node_base *p_Var4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> succ;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_50;
  unsigned_long local_38;
  
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  pBVar3 = &func->bbs;
  p_Var4 = (_List_node_base *)pBVar3;
  while (p_Var4 = (((_List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_> *)
                   &p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var4 != (_List_node_base *)pBVar3) {
    local_50._M_impl.super__Vector_impl_data._M_start = (pointer)p_Var4[1]._M_next;
    pvVar2 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
             std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)__return_storage_ptr__,(key_type *)&local_50);
    std::vector<unsigned_long,std::allocator<unsigned_long>>::_M_assign_aux<unsigned_long_const*>
              (pvVar2,0,0);
  }
  p_Var4 = (_List_node_base *)pBVar3;
  while (p_Var4 = (((_List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_> *)
                   &p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var4 != (_List_node_base *)pBVar3) {
    ir::BasicBlock::getSuccessors
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_50,
               (BasicBlock *)(p_Var4 + 1));
    puVar1 = local_50._M_impl.super__Vector_impl_data._M_finish;
    for (__k = local_50._M_impl.super__Vector_impl_data._M_start; __k != puVar1; __k = __k + 1) {
      this = std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)__return_storage_ptr__,__k);
      local_38 = ((BasicBlock *)(p_Var4 + 1))->labelID;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                (this,&local_38);
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::unordered_map<std::size_t, std::vector<std::size_t>>
buildBlockPredecessors(const ir::FunctionModule &func) {
  std::unordered_map<std::size_t, std::vector<std::size_t>> res;
  for (auto &bb : func.getBBs())
    res[bb.getLabelID()] = {};

  for (auto &bb : func.getBBs()) {
    auto succ = bb.getSuccessors();
    for (auto &s : succ)
      res[s].emplace_back(bb.getLabelID());
  }

  return res;
}